

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_threads_disable_single(tsd_t *tsd,background_thread_info_t *info)

{
  int iVar1;
  background_thread_info_t *in_RSI;
  tsdn_t *in_RDI;
  void *ret;
  _Bool has_thread;
  arena_t *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  _Bool _Var3;
  
  if (in_RSI == duckdb_je_background_thread_info) {
    malloc_mutex_assert_owner((tsdn_t *)in_stack_ffffffffffffffb8,(malloc_mutex_t *)0x24c585d);
  }
  else {
    malloc_mutex_assert_not_owner((tsdn_t *)in_stack_ffffffffffffffb8,(malloc_mutex_t *)0x24c587a);
  }
  pre_reentrancy((tsd_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
  malloc_mutex_lock((tsdn_t *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    (malloc_mutex_t *)in_RDI);
  if (in_RSI->state == background_thread_started) {
    bVar2 = 1;
    in_RSI->state = background_thread_stopped;
    pthread_cond_signal((pthread_cond_t *)&in_RSI->cond);
  }
  else {
    bVar2 = 0;
  }
  malloc_mutex_unlock(in_RDI,(malloc_mutex_t *)in_RSI);
  if ((bVar2 & 1) == 0) {
    post_reentrancy((tsd_t *)0x24c590c);
    _Var3 = false;
  }
  else {
    iVar1 = pthread_join(in_RSI->thread,(void **)&stack0xffffffffffffffb8);
    if (iVar1 == 0) {
      duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
      post_reentrancy((tsd_t *)0x24c595f);
      _Var3 = false;
    }
    else {
      post_reentrancy((tsd_t *)0x24c5932);
      _Var3 = true;
    }
  }
  return _Var3;
}

Assistant:

static bool
background_threads_disable_single(tsd_t *tsd, background_thread_info_t *info) {
	if (info == &background_thread_info[0]) {
		malloc_mutex_assert_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	} else {
		malloc_mutex_assert_not_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	}

	pre_reentrancy(tsd, NULL);
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	bool has_thread;
	assert(info->state != background_thread_paused);
	if (info->state == background_thread_started) {
		has_thread = true;
		info->state = background_thread_stopped;
		pthread_cond_signal(&info->cond);
	} else {
		has_thread = false;
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

	if (!has_thread) {
		post_reentrancy(tsd);
		return false;
	}
	void *ret;
	if (pthread_join(info->thread, &ret)) {
		post_reentrancy(tsd);
		return true;
	}
	assert(ret == NULL);
	n_background_threads--;
	post_reentrancy(tsd);

	return false;
}